

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void CManager_free(CManager_conflict cm)

{
  _CMbuffer *p_Var1;
  FILE *__stream;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  attr_list *ptr;
  uint uVar5;
  long lVar6;
  CMbuffer ptr_00;
  timespec ts;
  
  INT_CMfree(cm->transports);
  cm->transports = (transport_entry_conflict *)0x0;
  cm->FFScontext = (FFSContext)0x0;
  INT_CMfree(cm->in_formats);
  for (lVar6 = 0; lVar6 < cm->reg_format_count; lVar6 = lVar6 + 1) {
    INT_CMfree(cm->reg_formats[lVar6]->format_name);
    INT_CMfree(cm->reg_formats[lVar6]);
  }
  INT_CMfree(cm->reg_formats);
  INT_CMfree(cm->reg_user_formats);
  INT_CMfree(cm->pbio_requests);
  INT_CMfree(cm->connections);
  pthread_mutex_destroy((pthread_mutex_t *)&cm->exchange_lock);
  pthread_mutex_destroy((pthread_mutex_t *)&cm->context_lock);
  ptr = cm->contact_lists;
  if (ptr != (attr_list *)0x0) {
    lVar6 = 0;
    while (*(attr_list *)((long)ptr + lVar6) != (attr_list)0x0) {
      CMint_free_attr_list
                (cm,*(attr_list *)((long)ptr + lVar6),
                 "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                 ,0x382);
      lVar6 = lVar6 + 8;
      ptr = cm->contact_lists;
    }
    INT_CMfree(ptr);
  }
  uVar5 = 0;
  ptr_00 = cm->cm_buffer_list;
  while (ptr_00 != (CMbuffer)0x0) {
    p_Var1 = ptr_00->next;
    iVar2 = CMtrace_val[9];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(cm,CMBufferVerbose);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        __stream = (FILE *)cm->CMTrace_file;
        _Var3 = getpid();
        pVar4 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",(long)_Var3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,
              "Final buffer disposition buf %d, %p, size %zd, ref_count %d\n",(ulong)uVar5,ptr_00,
              ptr_00->size,(ulong)(uint)ptr_00->ref_count);
      uVar5 = uVar5 + 1;
    }
    fflush((FILE *)cm->CMTrace_file);
    if (ptr_00->return_callback == (_func_void_void_ptr *)0x0) {
      INT_CMfree(ptr_00->buffer);
    }
    else {
      (*ptr_00->return_callback)(ptr_00->return_callback_data);
    }
    INT_CMfree(ptr_00);
    ptr_00 = p_Var1;
  }
  cm->cm_buffer_list = (CMbuffer)0x0;
  if (cm->shutdown_functions != (func_entry *)0x0) {
    INT_CMfree(cm->shutdown_functions);
  }
  INT_CMfree(cm->avail);
  INT_CMfree(cm);
  return;
}

Assistant:

static void
CManager_free(CManager cm)
{
    int i;
    CMbuffer list = NULL;

    INT_CMfree(cm->transports);
    cm->transports = NULL;
/*    free_FFSContext(cm->FFScontext);*/
    cm->FFScontext = NULL;
    INT_CMfree(cm->in_formats);

    for (i=0 ; i < cm->reg_format_count; i++) {
	INT_CMfree(cm->reg_formats[i]->format_name);
	INT_CMfree(cm->reg_formats[i]);
    }
    INT_CMfree(cm->reg_formats);

    /*
     *  Applications are expected to free the user contexts that 
     *  they request.  If they do this, there will be no user formats to
     *  free at this point.  (Doing so might result in double freeing.)
     */
    INT_CMfree(cm->reg_user_formats);

    INT_CMfree(cm->pbio_requests);

    INT_CMfree(cm->connections);

    thr_mutex_free(cm->exchange_lock);

    thr_mutex_free(cm->context_lock);

    if (cm->contact_lists != NULL) {
	i = 0;
	while(cm->contact_lists[i] != NULL) {
	    INT_CMfree_attr_list(cm, cm->contact_lists[i]);
	    i++;
	}
	INT_CMfree(cm->contact_lists);
    }
    list = cm->cm_buffer_list;
    i=0;
    while (list != NULL) {
	CMbuffer next = list->next;
	CMtrace_out(cm, CMBufferVerbose, "Final buffer disposition buf %d, %p, size %zd, ref_count %d\n", i++, list, list->size, list->ref_count);
	if (list->return_callback) {
	    (list->return_callback)(list->return_callback_data);
	} else {
	    INT_CMfree(list->buffer);
	}
	INT_CMfree(list);
	list = next;
    }
    cm->cm_buffer_list = NULL;
    if (cm->shutdown_functions) INT_CMfree(cm->shutdown_functions);
    INT_CMfree(cm->avail);
     INT_CMfree(cm);
 }